

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_debugger_type_*const_&,_const_debugger_type_*const_&> * __thiscall
Catch::ExprLhs<debugger_type_const*const&>::operator==
          (BinaryExpr<const_debugger_type_*const_&,_const_debugger_type_*const_&>
           *__return_storage_ptr__,ExprLhs<debugger_type_const*const&> *this,debugger_type **rhs)

{
  debugger_type **ppdVar1;
  debugger_type *pdVar2;
  debugger_type *pdVar3;
  StringRef local_40;
  
  ppdVar1 = *(debugger_type ***)this;
  pdVar2 = *ppdVar1;
  pdVar3 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = pdVar2 == pdVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021e110;
  __return_storage_ptr__->m_lhs = ppdVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }